

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::Swap(Reflection *this,Message *message1,Message *message2)

{
  uint uVar1;
  long lVar2;
  Message *message;
  ReflectionSchema *this_00;
  bool bVar3;
  int iVar4;
  uint32 uVar5;
  uint32 uVar6;
  LogMessage *pLVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Message *pMVar8;
  uint32 *puVar9;
  ulong uVar10;
  _Vector_impl_data *this_01;
  _Vector_impl_data *__x;
  ulong uVar11;
  Reflection *extraout_RDX;
  Reflection *extraout_RDX_00;
  int i_1;
  long lVar12;
  int i;
  long lVar13;
  FieldDescriptor *field;
  ulong uVar14;
  LogMessage local_90;
  uint32 *local_58;
  Message *local_50;
  ReflectionSchema *local_48;
  Message *local_40;
  LogFinisher local_31;
  undefined4 extraout_var_01;
  
  if (message1 != message2) {
    (*(message1->super_MessageLite)._vptr_MessageLite[0x13])(message1);
    if (extraout_RDX != this) {
      internal::LogMessage::LogMessage
                (&local_90,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x255);
      pLVar7 = internal::LogMessage::operator<<
                         (&local_90,"CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar7 = internal::LogMessage::operator<<(pLVar7,"First argument to Swap() (of type \"");
      iVar4 = (*(message1->super_MessageLite)._vptr_MessageLite[0x13])(message1);
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,*(string **)(CONCAT44(extraout_var,iVar4) + 8));
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar7 = internal::LogMessage::operator<<(pLVar7,*(string **)(this->descriptor_ + 8));
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=(&local_31,pLVar7);
      internal::LogMessage::~LogMessage(&local_90);
    }
    (*(message2->super_MessageLite)._vptr_MessageLite[0x13])(message2);
    if (extraout_RDX_00 != this) {
      internal::LogMessage::LogMessage
                (&local_90,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x25d);
      pLVar7 = internal::LogMessage::operator<<
                         (&local_90,"CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar7 = internal::LogMessage::operator<<(pLVar7,"Second argument to Swap() (of type \"");
      iVar4 = (*(message2->super_MessageLite)._vptr_MessageLite[0x13])(message2);
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,*(string **)(CONCAT44(extraout_var_00,iVar4) + 8));
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar7 = internal::LogMessage::operator<<(pLVar7,*(string **)(this->descriptor_ + 8));
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=(&local_31,pLVar7);
      internal::LogMessage::~LogMessage(&local_90);
    }
    uVar11 = (ulong)(uint)(this->schema_).metadata_offset_;
    uVar10 = *(ulong *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar11);
    uVar14 = uVar10;
    if ((uVar10 & 1) != 0) {
      uVar14 = *(ulong *)(uVar10 & 0xfffffffffffffffe);
    }
    uVar11 = *(ulong *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar11);
    if ((uVar11 & 1) != 0) {
      uVar11 = *(ulong *)(uVar11 & 0xfffffffffffffffe);
    }
    local_40 = message1;
    if (uVar14 == uVar11) {
      local_48 = &this->schema_;
      local_50 = message2;
      if ((this->schema_).has_bits_offset_ != -1) {
        local_58 = MutableHasBits(this,message1);
        puVar9 = MutableHasBits(this,message2);
        lVar12 = 0;
        iVar4 = 0;
        for (lVar13 = 0; lVar13 < *(int *)(this->descriptor_ + 0x68); lVar13 = lVar13 + 1) {
          lVar2 = *(long *)(this->descriptor_ + 0x28);
          if (*(int *)(lVar2 + 0x3c + lVar12) != 3) {
            bVar3 = internal::ReflectionSchema::InRealOneof
                              (local_48,(FieldDescriptor *)(lVar2 + lVar12));
            iVar4 = iVar4 + (uint)!bVar3;
          }
          lVar12 = lVar12 + 0x98;
        }
        uVar10 = (long)(iVar4 + 0x1f) / 0x20;
        uVar14 = uVar10 & 0xffffffff;
        uVar11 = 0;
        if ((int)uVar10 < 1) {
          uVar14 = 0;
        }
        for (; uVar14 != uVar11; uVar11 = uVar11 + 1) {
          uVar5 = local_58[uVar11];
          local_58[uVar11] = puVar9[uVar11];
          puVar9[uVar11] = uVar5;
        }
      }
      pMVar8 = local_40;
      lVar13 = 0;
      for (lVar12 = 0; message = local_50, lVar12 <= this->last_non_weak_field_index_;
          lVar12 = lVar12 + 1) {
        field = (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x28) + lVar13);
        bVar3 = internal::ReflectionSchema::InRealOneof(local_48,field);
        if (!bVar3) {
          SwapField(this,pMVar8,local_50,field);
        }
        lVar13 = lVar13 + 0x98;
      }
      uVar1 = *(uint *)(this->descriptor_ + 0x6c);
      uVar14 = 0;
      uVar10 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar10 = uVar14;
      }
      for (; this_00 = local_48, uVar10 * 0x30 - uVar14 != 0; uVar14 = uVar14 + 0x30) {
        lVar12 = *(long *)(this->descriptor_ + 0x30);
        if ((*(int *)(lVar12 + 0x18 + uVar14) != 1) ||
           (*(char *)(**(long **)(lVar12 + 0x20 + uVar14) + 0x41) == '\0')) {
          SwapOneofField(this,pMVar8,message,(OneofDescriptor *)(lVar12 + uVar14));
        }
      }
      if ((this->schema_).extensions_offset_ != -1) {
        uVar5 = internal::ReflectionSchema::GetExtensionSetOffset(local_48);
        uVar6 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
        internal::ExtensionSet::Swap
                  ((ExtensionSet *)
                   ((long)&(pMVar8->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),
                   (ExtensionSet *)
                   ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6));
      }
      this_01 = (_Vector_impl_data *)MutableUnknownFields(this,pMVar8);
      __x = (_Vector_impl_data *)MutableUnknownFields(this,message);
      std::
      _Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ::_Vector_impl_data::_M_swap_data(this_01,__x);
    }
    else {
      if ((uVar10 & 1) != 0) {
        uVar10 = *(ulong *)(uVar10 & 0xfffffffffffffffe);
      }
      iVar4 = (*(message1->super_MessageLite)._vptr_MessageLite[4])(message1,uVar10);
      pMVar8 = (Message *)CONCAT44(extraout_var_01,iVar4);
      (*(pMVar8->super_MessageLite)._vptr_MessageLite[0xf])(pMVar8,message2);
      (*(message2->super_MessageLite)._vptr_MessageLite[0xe])(message2,message1);
      Swap(this,message1,pMVar8);
      uVar10 = *(ulong *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                         (ulong)(uint)(this->schema_).metadata_offset_);
      if ((uVar10 & 1) != 0) {
        uVar10 = *(ulong *)(uVar10 & 0xfffffffffffffffe);
      }
      if (uVar10 == 0) {
        (*(pMVar8->super_MessageLite)._vptr_MessageLite[1])(pMVar8);
      }
    }
  }
  return;
}

Assistant:

void Reflection::Swap(Message* message1, Message* message2) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
      << "First argument to Swap() (of type \""
      << message1->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
      << "Second argument to Swap() (of type \""
      << message2->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  // Check that both messages are in the same arena (or both on the heap). We
  // need to copy all data if not, due to ownership semantics.
  if (GetArena(message1) != GetArena(message2)) {
    // Slow copy path.
    // Use our arena as temp space, if available.
    Message* temp = message1->New(GetArena(message1));
    temp->MergeFrom(*message2);
    message2->CopyFrom(*message1);
    Swap(message1, temp);
    if (GetArena(message1) == nullptr) {
      delete temp;
    }
    return;
  }

  if (schema_.HasHasbits()) {
    uint32* has_bits1 = MutableHasBits(message1);
    uint32* has_bits2 = MutableHasBits(message2);

    int fields_with_has_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (field->is_repeated() || schema_.InRealOneof(field)) {
        continue;
      }
      fields_with_has_bits++;
    }

    int has_bits_size = (fields_with_has_bits + 31) / 32;

    for (int i = 0; i < has_bits_size; i++) {
      std::swap(has_bits1[i], has_bits2[i]);
    }
  }

  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (schema_.InRealOneof(field)) continue;
    SwapField(message1, message2, field);
  }
  const int oneof_decl_count = descriptor_->oneof_decl_count();
  for (int i = 0; i < oneof_decl_count; i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    if (!oneof->is_synthetic()) {
      SwapOneofField(message1, message2, oneof);
    }
  }

  if (schema_.HasExtensionSet()) {
    MutableExtensionSet(message1)->Swap(MutableExtensionSet(message2));
  }

  MutableUnknownFields(message1)->Swap(MutableUnknownFields(message2));
}